

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

ssize_t __thiscall Clasp::Cli::WriteCnf::write(WriteCnf *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  pointer pLVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  undefined4 in_register_00000034;
  long lVar6;
  ulong uVar7;
  
  (this->lits_).ebo_.size = 0;
  (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0xa0))
            ((long *)CONCAT44(in_register_00000034,__fd),&this->lits_);
  uVar7 = (ulong)(this->lits_).ebo_.size;
  if (uVar7 != 0) {
    pLVar2 = (this->lits_).ebo_.buf;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&pLVar2->rep_ + lVar6);
      uVar5 = uVar1 >> 2;
      uVar3 = -uVar5;
      if ((uVar1 & 2) == 0) {
        uVar3 = uVar5;
      }
      fprintf((FILE *)this->str_,"%d ",(ulong)uVar3);
      lVar6 = lVar6 + 4;
    } while (uVar7 << 2 != lVar6);
  }
  iVar4 = fprintf((FILE *)this->str_,"%d\n",0);
  return CONCAT44(extraout_var,iVar4);
}

Assistant:

void WriteCnf::write(ClauseHead* h) {
	lits_.clear();
	h->toLits(lits_);
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end; ++it) {
		fprintf(str_, "%d ", toInt(*it));
	}
	fprintf(str_, "%d\n", 0);
}